

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O0

MENU * updateMenu(MENU *menu,WINDOW *win,SatLookAngles *sats,ITEM **items,string *itemStrs,
                 bool updatePositions)

{
  Tle *pTVar1;
  WINDOW *pWVar2;
  Tle *pTVar3;
  SatLookAngle *pSVar4;
  ostream *poVar5;
  undefined8 uVar6;
  unsigned_long *puVar7;
  double dVar8;
  int local_2f8;
  int local_2f4;
  unsigned_long local_2f0;
  size_t local_2e8;
  string local_2e0 [32];
  string local_2c0;
  int local_29c;
  string local_298;
  int local_274;
  string local_270;
  int local_24c;
  string local_248;
  int local_224;
  string local_220;
  int local_200;
  stringstream local_1f0 [8];
  stringstream ss;
  undefined1 local_1e0 [376];
  CoordTopocentric *local_68;
  CoordTopocentric *la;
  Tle *tle;
  size_t i;
  undefined8 uStack_48;
  int curIdx;
  ITEM *curItem;
  int local_38;
  int cols;
  int rows;
  bool updatePositions_local;
  string *itemStrs_local;
  ITEM **items_local;
  SatLookAngles *sats_local;
  WINDOW *win_local;
  MENU *menu_local;
  
  cols._3_1_ = updatePositions;
  _rows = itemStrs;
  itemStrs_local = (string *)items;
  items_local = (ITEM **)sats;
  sats_local = (SatLookAngles *)win;
  win_local = (WINDOW *)menu;
  if (updatePositions) {
    SatLookAngles::updateTimeAndPositions(sats);
    SatLookAngles::sort((SatLookAngles *)items_local);
  }
  if (sats_local == (SatLookAngles *)0x0) {
    local_2f4 = -1;
  }
  else {
    local_2f4 = *(short *)((long)&sats_local->_lat + 4) + 1;
  }
  local_38 = local_2f4;
  if (sats_local == (SatLookAngles *)0x0) {
    local_2f8 = -1;
  }
  else {
    local_2f8 = *(short *)((long)&sats_local->_lat + 6) + 1;
  }
  curItem._4_4_ = local_2f8;
  uStack_48 = current_item(win_local);
  i._4_4_ = item_index(uStack_48);
  if (i._4_4_ < 0) {
    i._4_4_ = 0;
  }
  tle = (Tle *)0x0;
  while( true ) {
    pTVar1 = tle;
    pTVar3 = (Tle *)SatLookAngles::size((SatLookAngles *)items_local);
    if (pTVar3 <= pTVar1) break;
    la = (CoordTopocentric *)SatLookAngles::operator[]((SatLookAngles *)items_local,(size_t)tle);
    pSVar4 = SatLookAngles::operator[]((SatLookAngles *)items_local,(size_t)tle);
    local_68 = &pSVar4->second;
    std::__cxx11::stringstream::stringstream(local_1f0);
    poVar5 = (ostream *)std::ostream::operator<<(local_1e0,std::left);
    local_200 = (int)std::setw(10);
    poVar5 = std::operator<<(poVar5,(_Setw)local_200);
    std::__cxx11::to_string(&local_220,(unsigned_long)tle);
    poVar5 = std::operator<<(poVar5,(string *)&local_220);
    local_224 = (int)std::setw(0x19);
    poVar5 = std::operator<<(poVar5,(_Setw)local_224);
    Tle::Name_abi_cxx11_(&local_248,(Tle *)la);
    poVar5 = std::operator<<(poVar5,(string *)&local_248);
    local_24c = (int)std::setw(0xf);
    poVar5 = std::operator<<(poVar5,(_Setw)local_24c);
    dVar8 = Util::RadiansToDegrees(local_68->azimuth);
    std::__cxx11::to_string(&local_270,dVar8);
    poVar5 = std::operator<<(poVar5,(string *)&local_270);
    local_274 = (int)std::setw(0xf);
    poVar5 = std::operator<<(poVar5,(_Setw)local_274);
    dVar8 = Util::RadiansToDegrees(local_68->elevation);
    std::__cxx11::to_string(&local_298,dVar8);
    poVar5 = std::operator<<(poVar5,(string *)&local_298);
    local_29c = (int)std::setw(0xc);
    poVar5 = std::operator<<(poVar5,(_Setw)local_29c);
    std::__cxx11::to_string(&local_2c0,local_68->range);
    std::operator<<(poVar5,(string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)(_rows + (long)tle),local_2e0);
    std::__cxx11::string::~string(local_2e0);
    if (*(long *)(&itemStrs_local->_M_dataplus + (long)tle * 8) != 0) {
      free_item(*(undefined8 *)(&itemStrs_local->_M_dataplus + (long)tle * 8));
    }
    uVar6 = std::__cxx11::string::c_str();
    uVar6 = new_item(uVar6,0);
    *(undefined8 *)(&itemStrs_local->_M_dataplus + (long)tle * 8) = uVar6;
    if (tle == (Tle *)(long)i._4_4_) {
      uStack_48 = *(undefined8 *)(&itemStrs_local->_M_dataplus + (long)tle * 8);
    }
    std::__cxx11::stringstream::~stringstream(local_1f0);
    tle = (Tle *)&(tle->name_).field_0x1;
  }
  if (win_local != (WINDOW *)0x0) {
    unpost_menu(win_local);
    free_menu(win_local);
  }
  win_local = (WINDOW *)new_menu(itemStrs_local);
  set_menu_mark(win_local,"->");
  pWVar2 = win_local;
  local_2e8 = SatLookAngles::size((SatLookAngles *)items_local);
  local_2f0 = (long)local_38 - 5;
  puVar7 = std::min<unsigned_long>(&local_2e8,&local_2f0);
  set_menu_format(pWVar2,*puVar7 & 0xffffffff,1);
  set_menu_win(win_local,sats_local);
  pWVar2 = win_local;
  uVar6 = derwin(sats_local,local_38 + -5,curItem._4_4_ + -2,2,1);
  set_menu_sub(pWVar2,uVar6);
  set_current_item(win_local,uStack_48);
  post_menu(win_local);
  return (MENU *)win_local;
}

Assistant:

static MENU *updateMenu(MENU *menu, WINDOW *win, SatLookAngles &sats,
                        ITEM **items, std::string *itemStrs,
                        bool updatePositions) {
  if (updatePositions) {
    sats.updateTimeAndPositions();
    sats.sort();
  }

  int rows, cols;
  getmaxyx(win, rows, cols);

  // Remember cursor position so we can restore it.
  ITEM *curItem = current_item(menu);
  int curIdx = item_index(curItem);
  if (curIdx < 0)
    curIdx = 0;

  // Create the strings (items) for the menu.
  for (size_t i = 0; i < sats.size(); ++i) {
    const auto &tle = sats[i].first;
    const auto &la = sats[i].second;
    std::stringstream ss;
    ss << std::left << std::setw(10) << std::to_string(i) << std::setw(25)
       << tle.Name() << std::setw(15)
       << std::to_string(Util::RadiansToDegrees(la.azimuth)) << std::setw(15)
       << std::to_string(Util::RadiansToDegrees(la.elevation)) << std::setw(12)
       << std::to_string(la.range);
    itemStrs[i] = ss.str();
    if (items[i])
      free_item(items[i]);
    items[i] = new_item(itemStrs[i].c_str(), nullptr);

    if (i == (size_t)curIdx)
      curItem = items[i]; // Updated item at cursor position.
  }

  // Rebuild the menu (freeing the previous one).
  if (menu) {
    unpost_menu(menu);
    free_menu(menu);
  }
  menu = new_menu(items);
  set_menu_mark(menu, "->");
  set_menu_format(menu, std::min(sats.size(), (size_t)rows - 5), 1);
  set_menu_win(menu, win);
  set_menu_sub(menu, derwin(win, rows - 5, cols - 2, 2, 1));
  set_current_item(menu, curItem);
  post_menu(menu);
  return menu;
}